

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O2

bool __thiscall
Imath_2_5::Box<Imath_2_5::Vec3<float>_>::intersects
          (Box<Imath_2_5::Vec3<float>_> *this,Vec3<float> *point)

{
  float *pfVar1;
  float fVar2;
  byte bVar3;
  
  fVar2 = point->x;
  bVar3 = 0;
  if (((this->min).x <= fVar2) && (bVar3 = 0, fVar2 < (this->max).x || fVar2 == (this->max).x)) {
    fVar2 = point->y;
    bVar3 = 0;
    if (((this->min).y <= fVar2) && (pfVar1 = &(this->max).y, fVar2 < *pfVar1 || fVar2 == *pfVar1))
    {
      bVar3 = -((this->min).z <= point->z) & -(point->z <= (this->max).z);
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

inline bool
Box<Vec3<T> >::intersects (const Vec3<T> &point) const
{
    if (point[0] < min[0] || point[0] > max[0] ||
        point[1] < min[1] || point[1] > max[1] ||
        point[2] < min[2] || point[2] > max[2])
        return false;

    return true;
}